

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

shared_ptr<boost::unit_test::decorator::base> * __thiscall
boost::shared_ptr<boost::unit_test::decorator::base>::operator=
          (shared_ptr<boost::unit_test::decorator::base> *this,
          shared_ptr<boost::unit_test::decorator::base> *r)

{
  element_type *peVar1;
  sp_counted_base *psVar2;
  shared_count sStack_10;
  
  peVar1 = r->px;
  psVar2 = (r->pn).pi_;
  r->px = (element_type *)0x0;
  (r->pn).pi_ = (sp_counted_base *)0x0;
  sStack_10.pi_ = (this->pn).pi_;
  this->px = peVar1;
  (this->pn).pi_ = psVar2;
  detail::shared_count::~shared_count(&sStack_10);
  return this;
}

Assistant:

shared_ptr & operator=( shared_ptr && r ) BOOST_SP_NOEXCEPT
    {
        this_type( static_cast< shared_ptr && >( r ) ).swap( *this );
        return *this;
    }